

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

void pbrt::ply::parse(string *fileName,
                     vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *pos,
                     vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *nor,
                     vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *tex,
                     vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *idx)

{
  int iVar1;
  runtime_error *prVar2;
  char *pcVar3;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *in_RCX;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *in_RDX;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *in_RSI;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *in_R8;
  char *pname_1;
  p_ply_property property_1;
  char *pname;
  p_ply_property property;
  bool has_uv_components [2];
  bool has_normal_components [3];
  bool has_position_components [3];
  long instance_count;
  char *name;
  p_ply_element element;
  char *vertex_indices_name;
  char *tex_coord_v_name;
  char *tex_coord_u_name;
  bool has_indices;
  bool has_uvs;
  bool has_normals;
  long face_count;
  long vertex_count;
  p_ply ply;
  p_ply in_stack_fffffffffffffdf8;
  void *in_stack_fffffffffffffe00;
  p_ply in_stack_fffffffffffffe08;
  p_ply_error_cb in_stack_fffffffffffffe10;
  p_ply_read_cb read_cb;
  p_ply in_stack_fffffffffffffe18;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *in_stack_fffffffffffffe20;
  p_ply in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  byte local_18a;
  byte local_189;
  string local_168 [39];
  undefined1 local_141;
  string local_140 [32];
  p_ply_read_cb local_120;
  p_ply_property local_118;
  undefined1 local_109;
  string local_108 [32];
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *local_e8;
  p_ply_property local_e0;
  byte local_d8;
  byte local_d7;
  byte local_d6;
  byte local_d5;
  byte local_d4;
  byte local_d3;
  byte local_d2;
  byte local_d1;
  long local_d0;
  char *local_c8;
  p_ply_element local_c0;
  p_ply_read_cb local_b8;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *local_b0;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *local_a8;
  byte local_9b;
  byte local_9a;
  byte local_99;
  long local_98;
  long local_90;
  undefined1 local_81;
  undefined1 local_5d;
  p_ply local_30;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *local_28;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *local_20;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_18;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::c_str();
  local_30 = ply_open((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      (long)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  if (local_30 == (p_ply)0x0) {
    local_5d = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::runtime_error::runtime_error(prVar2,pcVar3);
    local_5d = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = ply_read_header(in_stack_fffffffffffffdf8);
  if (iVar1 == 0) {
    local_81 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::runtime_error::runtime_error(prVar2,pcVar3);
    local_81 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_90 = 0;
  local_98 = 0;
  local_99 = 0;
  local_9a = 0;
  local_9b = 0;
  local_a8 = (vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *)0x0;
  local_b0 = (vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *)0x0;
  local_b8 = (p_ply_read_cb)0x0;
  local_c0 = (p_ply_element)0x0;
  while (local_c0 = ply_get_next_element(local_30,local_c0), local_c0 != (p_ply_element)0x0) {
    ply_get_element_info(local_c0,&local_c8,&local_d0);
    iVar1 = strcmp(local_c8,"vertex");
    if (iVar1 == 0) {
      local_90 = local_d0;
      memset(&local_d3,0,3);
      memset(&local_d6,0,3);
      memset(&local_d8,0,2);
      local_e0 = (p_ply_property)0x0;
      while (local_e0 = ply_get_next_property(local_c0,local_e0), local_e0 != (p_ply_property)0x0) {
        ply_get_property_info
                  (local_e0,(char **)&local_e8,(e_ply_type *)0x0,(e_ply_type *)0x0,(e_ply_type *)0x0
                  );
        iVar1 = strcmp((char *)local_e8,"x");
        if (iVar1 == 0) {
          local_d3 = 1;
        }
        else {
          iVar1 = strcmp((char *)local_e8,"y");
          if (iVar1 == 0) {
            local_d2 = 1;
          }
          else {
            iVar1 = strcmp((char *)local_e8,"z");
            if (iVar1 == 0) {
              local_d1 = 1;
            }
            else {
              iVar1 = strcmp((char *)local_e8,"nx");
              if (iVar1 == 0) {
                local_d6 = 1;
              }
              else {
                iVar1 = strcmp((char *)local_e8,"ny");
                if (iVar1 == 0) {
                  local_d5 = 1;
                }
                else {
                  iVar1 = strcmp((char *)local_e8,"nz");
                  if (iVar1 == 0) {
                    local_d4 = 1;
                  }
                  else {
                    iVar1 = strcmp((char *)local_e8,"u");
                    if (((iVar1 == 0) || (iVar1 = strcmp((char *)local_e8,"s"), iVar1 == 0)) ||
                       ((iVar1 = strcmp((char *)local_e8,"texture_u"), iVar1 == 0 ||
                        (iVar1 = strcmp((char *)local_e8,"texture_s"), iVar1 == 0)))) {
                      local_d8 = 1;
                      local_a8 = local_e8;
                    }
                    else {
                      iVar1 = strcmp((char *)local_e8,"v");
                      if ((((iVar1 == 0) || (iVar1 = strcmp((char *)local_e8,"t"), iVar1 == 0)) ||
                          (iVar1 = strcmp((char *)local_e8,"texture_v"), iVar1 == 0)) ||
                         (iVar1 = strcmp((char *)local_e8,"texture_t"), iVar1 == 0)) {
                        local_d7 = 1;
                        local_b0 = local_e8;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((((local_d3 & 1) == 0) || ((local_d2 & 1) == 0)) || ((local_d1 & 1) == 0)) {
        local_109 = 1;
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
        std::runtime_error::runtime_error(prVar2,local_108);
        local_109 = 0;
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_189 = 0;
      if (((local_d6 & 1) != 0) && (local_189 = 0, (local_d5 & 1) != 0)) {
        local_189 = local_d4;
      }
      local_99 = local_189 & 1;
      local_18a = 0;
      if ((local_d8 & 1) != 0) {
        local_18a = local_d7;
      }
      local_9a = local_18a & 1;
      local_e0 = (p_ply_property)0x0;
    }
    else {
      iVar1 = strcmp(local_c8,"face");
      if (iVar1 == 0) {
        local_98 = local_d0;
        local_118 = (p_ply_property)0x0;
        while (local_118 = ply_get_next_property(local_c0,local_118),
              local_118 != (p_ply_property)0x0) {
          ply_get_property_info
                    (local_118,(char **)&local_120,(e_ply_type *)0x0,(e_ply_type *)0x0,
                     (e_ply_type *)0x0);
          iVar1 = strcmp((char *)local_120,"vertex_index");
          if ((iVar1 == 0) || (iVar1 = strcmp((char *)local_120,"vertex_indices"), iVar1 == 0)) {
            local_9b = 1;
            local_b8 = local_120;
          }
        }
        local_118 = (p_ply_property)0x0;
      }
    }
  }
  if ((local_90 == 0) || (local_98 == 0)) {
    local_141 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
    std::runtime_error::runtime_error(prVar2,local_140);
    local_141 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::resize
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
  if ((local_99 & 1) != 0) {
    std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::resize
              ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
               in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
  }
  if ((local_9a & 1) != 0) {
    std::vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::resize
              (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
  }
  if ((local_9b & 1) != 0) {
    std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::resize
              ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
               in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
  }
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[](local_10,0);
  ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                  (char *)in_stack_fffffffffffffe18,(p_ply_read_cb)in_stack_fffffffffffffe10,
                  in_stack_fffffffffffffe08,(long)in_stack_fffffffffffffe00);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[](local_10,0);
  ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                  (char *)in_stack_fffffffffffffe18,(p_ply_read_cb)in_stack_fffffffffffffe10,
                  in_stack_fffffffffffffe08,(long)in_stack_fffffffffffffe00);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[](local_10,0);
  ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                  (char *)in_stack_fffffffffffffe18,(p_ply_read_cb)in_stack_fffffffffffffe10,
                  in_stack_fffffffffffffe08,(long)in_stack_fffffffffffffe00);
  if ((local_99 & 1) != 0) {
    std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[](local_18,0);
    ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                    (char *)in_stack_fffffffffffffe18,(p_ply_read_cb)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe08,(long)in_stack_fffffffffffffe00);
    std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[](local_18,0);
    ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                    (char *)in_stack_fffffffffffffe18,(p_ply_read_cb)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe08,(long)in_stack_fffffffffffffe00);
    std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[](local_18,0);
    ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                    (char *)in_stack_fffffffffffffe18,(p_ply_read_cb)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe08,(long)in_stack_fffffffffffffe00);
  }
  if ((local_9a & 1) != 0) {
    in_stack_fffffffffffffe18 = local_30;
    in_stack_fffffffffffffe20 = local_a8;
    std::vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::operator[](local_20,0);
    ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                    (char *)in_stack_fffffffffffffe18,(p_ply_read_cb)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe08,(long)in_stack_fffffffffffffe00);
    in_stack_fffffffffffffe28 = local_30;
    std::vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::operator[](local_20,0);
    ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                    (char *)in_stack_fffffffffffffe18,(p_ply_read_cb)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe08,(long)in_stack_fffffffffffffe00);
  }
  if ((local_9b & 1) != 0) {
    in_stack_fffffffffffffe08 = local_30;
    read_cb = local_b8;
    std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::operator[](local_28,0);
    ply_set_read_cb(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                    (char *)in_stack_fffffffffffffe18,read_cb,in_stack_fffffffffffffe08,
                    (long)in_stack_fffffffffffffe00);
  }
  iVar1 = ply_read(in_stack_fffffffffffffe08);
  if (iVar1 != 0) {
    ply_close(in_stack_fffffffffffffe08);
    return;
  }
  ply_close(in_stack_fffffffffffffe08);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
  std::runtime_error::runtime_error(prVar2,local_168);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse(const std::string &fileName,
      std::vector<vec3f> &pos,
      std::vector<vec3f> &nor,
      std::vector<vec2f> &tex,
      std::vector<vec3i> &idx)
    {
      p_ply ply = ply_open(fileName.c_str(), nullptr, 0, nullptr);
      if (!ply)
        throw std::runtime_error(std::string("Couldn't open PLY file " + fileName).c_str());

      if (!ply_read_header(ply))
        throw std::runtime_error(std::string("Unable to read the header of PLY file " + fileName).c_str());

      long vertex_count = 0;
      long face_count = 0;
      bool has_normals = false;
      bool has_uvs = false;
      bool has_indices = false;
      const char* tex_coord_u_name = nullptr;
      const char* tex_coord_v_name = nullptr;
      const char* vertex_indices_name = nullptr;

      // Inspect structure of the PLY file.
      p_ply_element element = nullptr;
      while ((element = ply_get_next_element(ply, element)) != nullptr) {
        const char* name;
        long instance_count;
        ply_get_element_info(element, &name, &instance_count);

        // Check for vertex element.
        if (strcmp(name, "vertex") == 0) {
          vertex_count = instance_count;

          bool has_position_components[3] = {false};
          bool has_normal_components[3] = {false};
          bool has_uv_components[2] = {false};
         
          // Inspect vertex properties.
          p_ply_property property = nullptr;
          while ((property = ply_get_next_property(element, property)) != nullptr) {
            const char* pname;
            ply_get_property_info(property, &pname, nullptr, nullptr, nullptr);

            if (!strcmp(pname, "x"))
              has_position_components[0] = true;
            else if (!strcmp(pname, "y"))
              has_position_components[1] = true;
            else if (!strcmp(pname, "z"))
              has_position_components[2] = true;
            else if (!strcmp(pname, "nx"))
              has_normal_components[0] = true;
            else if (!strcmp(pname, "ny"))
              has_normal_components[1] = true;
            else if (!strcmp(pname, "nz"))
              has_normal_components[2] = true;
            else if (!strcmp(pname, "u") || !strcmp(pname, "s") || !strcmp(pname, "texture_u") || !strcmp(pname, "texture_s")) {
              has_uv_components[0] = true;
              tex_coord_u_name = pname;
            }
            else if (!strcmp(pname, "v") || !strcmp(pname, "t") || !strcmp(pname, "texture_v") || !strcmp(pname, "texture_t")) {
              has_uv_components[1] = true;
              tex_coord_v_name = pname;
            }
          }

          if (!(has_position_components[0] && has_position_components[1] && has_position_components[2]))
            throw std::runtime_error(fileName + ": Vertex coordinate property not found!");

          has_normals = has_normal_components[0] && has_normal_components[1] && has_normal_components[2];
          has_uvs = has_uv_components[0] && has_uv_components[1];
        }

        // Check for face element.
        else if (strcmp(name, "face") == 0) {
          face_count = instance_count;

          // Inspect face properties.
          p_ply_property property = nullptr;
          while ((property = ply_get_next_property(element, property)) != nullptr) {
            const char* pname;
            ply_get_property_info(property, &pname, nullptr, nullptr, nullptr);
            if (!strcmp(pname, "vertex_index") || !strcmp(pname, "vertex_indices")) {
              has_indices = true;
              vertex_indices_name = pname;
            }
          }
        }
      }

      if (vertex_count == 0 || face_count == 0)
        throw std::runtime_error(fileName + ": PLY file is invalid! No face/vertex elements found!");

      pos.resize(vertex_count);
      if (has_normals)
        nor.resize(vertex_count);
      if (has_uvs)
        tex.resize(vertex_count);
      if (has_indices)
        idx.resize(face_count);

      // Set callbacks to process the PLY properties.
      ply_set_read_cb(ply, "vertex", "x", rply_vertex_callback_vec3, &pos[0].x, 0);
      ply_set_read_cb(ply, "vertex", "y", rply_vertex_callback_vec3, &pos[0].y, 0);
      ply_set_read_cb(ply, "vertex", "z", rply_vertex_callback_vec3, &pos[0].z, 0);

      if (has_normals) {
        ply_set_read_cb(ply, "vertex", "nx", rply_vertex_callback_vec3, &nor[0].x, 0);
        ply_set_read_cb(ply, "vertex", "ny", rply_vertex_callback_vec3, &nor[0].y, 0);
        ply_set_read_cb(ply, "vertex", "nz", rply_vertex_callback_vec3, &nor[0].z, 0);
      }

      if (has_uvs) {
        ply_set_read_cb(ply, "vertex", tex_coord_u_name, rply_vertex_callback_vec2, &tex[0].x, 0);
        ply_set_read_cb(ply, "vertex", tex_coord_v_name, rply_vertex_callback_vec2, &tex[0].y, 0);
      }

      if (has_indices) {
        ply_set_read_cb(ply, "face", vertex_indices_name, rply_face_callback, &idx[0].x, 0);
      }

      // Read ply file.
      if (!ply_read(ply)) {
        ply_close(ply);
        throw std::runtime_error(fileName + ": unable to read the contents of PLY file");
      }
      ply_close(ply);
    }